

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Writer_EveryoneWrites_Async.cpp
# Opt level: O0

void __thiscall
adios2::core::engine::BP5Writer::AsyncWriteDataCleanup_EveryoneWrites(BP5Writer *this)

{
  void *pvVar1;
  long in_RDI;
  AsyncWriteInfo *this_00;
  
  if ((*(long *)(*(long *)(in_RDI + 0xd48) + 0x28) != 0) &&
     (pvVar1 = *(void **)(*(long *)(in_RDI + 0xd48) + 0x28), pvVar1 != (void *)0x0)) {
    shm::TokenChain<unsigned_long>::~TokenChain((TokenChain<unsigned_long> *)this);
    operator_delete(pvVar1);
  }
  this_00 = *(AsyncWriteInfo **)(in_RDI + 0xd48);
  if (this_00 != (AsyncWriteInfo *)0x0) {
    AsyncWriteInfo::~AsyncWriteInfo(this_00);
    operator_delete(this_00);
  }
  *(undefined8 *)(in_RDI + 0xd48) = 0;
  return;
}

Assistant:

void BP5Writer::AsyncWriteDataCleanup_EveryoneWrites()
{
    if (m_AsyncWriteInfo->tokenChain)
    {
        delete m_AsyncWriteInfo->tokenChain;
    }
    delete m_AsyncWriteInfo;
    m_AsyncWriteInfo = nullptr;
}